

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.h
# Opt level: O1

void image_32_filter_75_case(response_layer *layer,integral_image *iimage)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  float *pfVar4;
  bool *pbVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  float *pfVar15;
  uint uVar16;
  float *pfVar17;
  int iVar18;
  int iVar19;
  float *pfVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  long lVar33;
  float *pfVar34;
  int iVar35;
  long lVar36;
  int iVar37;
  bool *pbVar38;
  float fVar39;
  float afStack_178 [34];
  long local_f0;
  long local_e8;
  float *local_e0;
  long local_d8;
  float *data;
  long local_c0;
  long local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float *local_98;
  ulong local_90;
  float *local_60;
  float *local_40;
  
  iVar19 = iimage->data_width;
  uVar26 = iimage->width;
  iVar18 = iimage->height;
  pfVar3 = iimage->data;
  iVar2 = layer->step;
  lVar33 = (long)iVar2;
  iVar24 = layer->filter_size;
  iVar11 = iVar24 / 3;
  lVar12 = -0x178 - ((ulong)uVar26 * 4 + 0xf & 0xfffffffffffffff0);
  lVar36 = layer->width * lVar33;
  iVar35 = (int)lVar36;
  if (iVar35 - iVar11 == 0 || iVar35 < iVar11) {
    lVar22 = 0;
  }
  else {
    lVar22 = 0;
    do {
      *(float *)((long)afStack_178 + lVar22 * 4 + lVar12 + 0x178) =
           pfVar3[iVar11 + -1 + (iVar18 + -1) * iVar19 + (int)lVar22];
      lVar22 = lVar22 + lVar33;
    } while (lVar22 < (long)(ulong)(uint)(iVar35 - iVar11));
  }
  iVar18 = (iVar18 + -1) * iVar19;
  fVar39 = pfVar3[(int)((uVar26 - 1) + iVar18)];
  uVar14 = (ulong)iVar11;
  local_90 = uVar14;
  if ((int)lVar22 < iVar11) {
    lVar22 = (long)(int)lVar22;
    do {
      *(float *)((long)afStack_178 + lVar22 * 4 + lVar12 + 0x178) = fVar39;
      lVar22 = lVar22 + lVar33;
    } while (lVar22 < (long)uVar14);
  }
  iVar37 = layer->height;
  iVar21 = (int)lVar22;
  local_d8 = (long)iVar19;
  if (iVar21 < iVar35) {
    lVar22 = (long)iVar21;
    iVar19 = (iVar18 + iVar21) - iVar11;
    do {
      *(float *)((long)afStack_178 + lVar22 * 4 + lVar12 + 0x178) = fVar39 - pfVar3[iVar19];
      lVar22 = lVar22 + lVar33;
      iVar19 = iVar19 + iVar2;
    } while (lVar22 < lVar36);
  }
  uVar26 = iVar37 * iVar2;
  if (0 < (int)uVar26) {
    uVar13 = (iVar24 + -1) - (iVar24 + -1 >> 0x1f) >> 1;
    lVar22 = local_d8 * local_90;
    pfVar32 = pfVar3 + -local_d8;
    lVar27 = (local_90 - 1) * local_d8;
    lVar23 = ~local_90 * local_d8;
    uVar14 = local_90 * 4 ^ 0xfffffffffffffffc;
    lVar36 = (long)pfVar3 + uVar14;
    fVar39 = 1.0 / (float)(iVar24 * iVar24);
    pfVar4 = layer->response;
    pbVar5 = layer->laplacian;
    lVar25 = (long)(iVar24 / 6);
    uVar16 = ~(iVar24 / 6);
    local_b0 = pfVar3 + lVar22;
    lVar28 = lVar33 * local_d8;
    lVar29 = lVar28 * 4;
    local_a8 = pfVar3 + lVar23;
    local_a0 = pfVar3 + ((lVar27 + -1) - lVar25);
    local_b8 = (lVar25 * 4 + lVar22 * 4 ^ 0xfffffffffffffffcU) + (long)pfVar3;
    pfVar15 = pfVar3 + lVar27 + (int)uVar13;
    pfVar17 = pfVar3 + ((int)uVar13 - lVar22);
    pfVar30 = (float *)((local_d8 * 4 + 4) * local_90 + (long)pfVar3);
    pfVar31 = pfVar3 + (local_90 - local_d8);
    pfVar20 = pfVar3 + lVar23 + local_90;
    iVar37 = (int)local_d8;
    iVar19 = (iVar11 + uVar16) * iVar37;
    iVar18 = uVar16 * iVar37;
    local_40 = pfVar3 + ((lVar27 + (local_90 - 1)) - lVar25);
    local_f0 = (local_d8 * -4 + 4) * local_90 + lVar25 * -4 + -4 + (long)pfVar3;
    lVar22 = uVar14 + local_d8 * -4 + (long)pfVar3;
    local_60 = pfVar3 + ((lVar23 + -1) - local_90);
    local_e8 = (local_d8 * 4 + -4) * local_90 + -4 + (long)pfVar3;
    pfVar1 = pfVar3 + local_90;
    local_c0 = 0;
    iVar24 = 0;
    local_e0 = pfVar1;
    local_98 = pfVar3;
    do {
      if (0 < iVar35) {
        pfVar34 = pfVar4 + iVar24;
        pbVar38 = pbVar5 + iVar24;
        lVar23 = 0;
        uVar16 = ~uVar13;
        do {
          auVar9 = vfmadd213ss_fma(ZEXT416((uint)((pfVar3[(iVar18 + lVar23) - local_90] -
                                                  pfVar3[(iVar19 + lVar23) - local_90]) +
                                                 (pfVar1[(long)iVar19 + lVar23 + -2] -
                                                 pfVar1[(long)iVar18 + lVar23 + -2]))),
                                   SUB6416(ZEXT464(0xc0400000),0),
                                   ZEXT416(*(uint *)((long)afStack_178 + lVar23 * 4 + lVar12 + 0x178
                                                    )));
          auVar10 = vfmadd213ss_fma(ZEXT416((uint)((*(float *)(local_b8 + lVar23 * 4) -
                                                   local_a0[lVar23]) +
                                                  (local_40[lVar23] -
                                                  *(float *)(local_f0 + lVar23 * 4)))),
                                    SUB6416(ZEXT464(0xc0400000),0),
                                    ZEXT416((uint)((pfVar3[(local_c0 - local_90) * local_d8 +
                                                           (long)(int)uVar16] -
                                                   pfVar3[(local_c0 + -1 + local_90) * local_d8 +
                                                          (long)(int)uVar16]) +
                                                  (pfVar15[lVar23] - pfVar17[lVar23]))));
          fVar6 = fVar39 * auVar9._0_4_;
          fVar7 = fVar39 * auVar10._0_4_;
          fVar8 = fVar39 * ((((local_a8[lVar23] - pfVar32[lVar23]) +
                              (pfVar31[lVar23] - pfVar20[lVar23]) +
                             (local_b0[lVar23 + -1] - local_98[lVar23 + -1]) +
                             (*(float *)(lVar36 + lVar23 * 4) - *(float *)(local_e8 + lVar23 * 4)))
                            - ((pfVar32[lVar23 + -1] - local_a8[lVar23 + -1]) +
                              (local_60[lVar23] - *(float *)(lVar22 + lVar23 * 4)))) -
                           ((pfVar30[lVar23] - local_e0[lVar23]) +
                           (local_98[lVar23] - local_b0[lVar23])));
          auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fVar8 * -0.81)),ZEXT416((uint)fVar7),
                                   ZEXT416((uint)fVar6));
          *pfVar34 = auVar9._0_4_;
          *pbVar38 = 0.0 <= fVar6 + fVar7;
          lVar23 = lVar23 + lVar33;
          uVar16 = uVar16 + iVar2;
          pfVar34 = pfVar34 + 1;
          pbVar38 = pbVar38 + 1;
          iVar24 = iVar24 + 1;
        } while (lVar23 < iVar35);
      }
      local_c0 = local_c0 + lVar33;
      local_b0 = local_b0 + lVar28;
      local_98 = local_98 + lVar28;
      pfVar32 = pfVar32 + lVar28;
      local_a8 = local_a8 + lVar28;
      local_a0 = local_a0 + lVar28;
      local_b8 = local_b8 + lVar29;
      pfVar15 = pfVar15 + lVar28;
      pfVar17 = pfVar17 + lVar28;
      pfVar30 = pfVar30 + lVar28;
      local_e0 = local_e0 + lVar28;
      pfVar31 = pfVar31 + lVar28;
      pfVar20 = pfVar20 + lVar28;
      iVar19 = iVar19 + iVar2 * iVar37;
      iVar18 = iVar18 + iVar2 * iVar37;
      local_40 = local_40 + lVar28;
      local_f0 = local_f0 + lVar29;
      lVar22 = lVar22 + lVar29;
      local_60 = local_60 + lVar28;
      local_e8 = local_e8 + lVar29;
      lVar36 = lVar36 + lVar29;
    } while (local_c0 < (long)(ulong)uVar26);
  }
  return;
}

Assistant:

inline void image_32_filter_75_case(struct response_layer *layer, struct integral_image *iimage) {
    int height = layer->height;
    int width = layer->width;

    int data_width = iimage->data_width;

    int iwidth = iimage->width;
    int iheight = iimage->height;

    float *data = (float *) iimage->data;
    int step = layer->step;
    int filter_size = layer->filter_size;
    int border = (filter_size - 1) / 2;
    int lobe = filter_size / 3;
    float inv_area = 1.f/(filter_size*filter_size);

    float Dxx, Dyy, Dxy, Dyy0, Dyy1, A, B, C, D;
    float A0, A1, B0, B1, C0, C1, D0, D1;
    int r10, r11, c10, c11, r00, r01, c00, c01;
    float* response = layer->response;
    bool* laplacian = layer->laplacian;

    int ind = 0;

    int k, k0, i, j, t0, t1, t2, t3, t4, t5, t6, t7, t8, t9;
    int x = 0;
    int y = 0;

    /* 2.2.b Half the filter is longer than the image, but narrower.
    // HERE: width > lobe and height <= border
    // Here only the whole filter is optimized, not negative part

    // Only happens for filter: 75 and image: 32

    // A, B = 0
    // D is outside (i.e. below) the image, but the columns change.
    // => D = [height-1, some_column]
    // C = 0 or [height-1, some_column]
    */

    // Create array for Dyy that has image width length
    // all rows (for big part) have same Dyy values
    float Dyy_arr[iwidth];  // stack is faster than heap

    // C = 0 and D = [height-1, some_column]
    // from y = 0 until D is (exclusive) in last column
    for (i = 0; i < width*step-lobe; i += step) {  // 0 - 7
        // C = 0
        // D = [height-1, i+lobe-1]
        D = data[(iheight-1) * data_width + (i+lobe-1)];
        Dyy_arr[i] = D;
    }

    // only bottom left corner value needed
    D = data[(iheight-1) * data_width + (iwidth-1)];

    // C = 0 and D = [height-1, width-1] (below or right of bottom corner)
    // C is still outside and D now too
    for (; i < lobe; i += step) {  // 7 - 25
        Dyy_arr[i] = D;
    }

    // if y = lobe, then C = [height-1, 0]
    // C = [height-1, some_column] and D = [height-1, width-1] (below or right of bottom corner)
    for (; i < width*step; i += step) {  // 25 - 32
        // C = [height-1, i-lobe]
        // D = [height-1, width-1]
        C = data[(iheight-1) * data_width + (i-lobe)];
        Dyy_arr[i] = D - C;
    }

    // Use precomputation for faster compute
    for (x = 0; x < height * step; x += step) {

        // precompute
        t0 = x - lobe;
        t1 = x + lobe - 1;
        t2 = lobe/2 + 1;
        t3 = x - 1;
        t5 = x - lobe - 1;
        t7 = x + lobe;
        t9 = x - lobe / 2 - 1;

        for (y = 0; y < width * step; y += step) {
            // box_integral_unconditional precompute
            t4 = y - 1;
            t6 = y - lobe - 1;
            t8 = y + lobe;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            Dyy = Dyy_arr[y] - 3 * box_integral_unconditional_opt(iimage, t9, t6 + 1, t9 + lobe , t8 - 2);

            // Compute Dxx, Dxy
            Dxx = box_integral_unconditional_opt(iimage, t0, y-border-1, t1, y+border)
                - 3 * box_integral_unconditional_opt(iimage, t0, y-t2, t1, t8-t2);
            Dxy = box_integral_unconditional_opt(iimage, t5, y, t3, t8)
                    + box_integral_unconditional_opt(iimage, x, t6, t7, t4)
                    - box_integral_unconditional_opt(iimage, t5, t6, t3, t4)
                    - box_integral_unconditional_opt(iimage, x, y, t7, t8);

            // Normalize Responses with inverse area
            Dyy *= inv_area;
            Dxx *= inv_area;
            Dxy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy - 0.81f * Dxy * Dxy;

            // Calculate Laplacian
            laplacian[ind] = Dxx + Dyy >= 0;

            // Increment index
            ind += 1;
        }
    }
}